

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZQuadTorus.h
# Opt level: O3

void __thiscall
pzgeom::TPZQuadTorus::X<double>
          (TPZQuadTorus *this,TPZFMatrix<double> *nodes,TPZVec<double> *loc,TPZVec<double> *result)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  TPZManVector<double,_2> resloc;
  TPZVec<double> local_58;
  double local_38 [2];
  
  TPZVec<double>::TPZVec(&local_58,0);
  local_58._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0181c090;
  local_58.fNElements = 2;
  local_58.fNAlloc = 0;
  local_58.fStore = local_38;
  TPZGeoQuad::X<double>(&(this->fPhiTheta).super_TPZFMatrix<double>,loc,&local_58);
  dVar1 = this->fR;
  dVar4 = this->fr;
  dVar2 = cos(*local_58.fStore);
  dVar3 = cos(local_58.fStore[1]);
  *result->fStore = dVar3 * (dVar2 * dVar4 + dVar1);
  dVar1 = this->fR;
  dVar4 = this->fr;
  dVar2 = cos(*local_58.fStore);
  dVar3 = sin(local_58.fStore[1]);
  result->fStore[1] = dVar3 * (dVar2 * dVar4 + dVar1);
  dVar1 = this->fr;
  dVar4 = sin(*local_58.fStore);
  result->fStore[2] = dVar4 * dVar1;
  if (local_58.fStore != local_38) {
    local_58.fNAlloc = 0;
    local_58._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    if (local_58.fStore != (double *)0x0) {
      operator_delete__(local_58.fStore);
    }
  }
  return;
}

Assistant:

void X(const TPZFMatrix<REAL> &nodes,TPZVec<T> &loc,TPZVec<T> &result) const
        {
            TPZManVector<T,2> resloc(2);
            TPZGeoQuad::X(this->fPhiTheta,loc,resloc);
            
            result[0] = (fR + fr*cos(resloc[0]))*cos(resloc[1]);
            result[1] = (fR + fr*cos(resloc[0]))*sin(resloc[1]);
            result[2] = fr*sin(resloc[0]);
            
        }